

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAiger.c
# Opt level: O1

Vec_Int_t * Gia_AigerCollectLiterals(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  int *piVar3;
  Vec_Int_t *pVVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  
  iVar7 = p->vCos->nSize - p->nRegs;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar2 = 0x10;
  if (0xe < iVar7 - 1U) {
    iVar2 = iVar7;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar2;
  if (iVar2 == 0) {
    piVar3 = (int *)0x0;
  }
  else {
    piVar3 = (int *)malloc((long)iVar2 << 2);
  }
  p_00->pArray = piVar3;
  iVar2 = p->nRegs;
  if (0 < iVar2) {
    iVar7 = 0;
    do {
      iVar1 = p->vCos->nSize;
      uVar6 = (iVar1 - iVar2) + iVar7;
      if (((int)uVar6 < 0) || (iVar1 <= (int)uVar6)) goto LAB_001ce36b;
      iVar2 = p->vCos->pArray[uVar6];
      if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_001ce34c;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      uVar6 = *(uint *)(p->pObjs + iVar2);
      iVar2 = iVar2 - (uVar6 & 0x1fffffff);
      if (iVar2 < 0) goto LAB_001ce38a;
      Vec_IntPush(p_00,(uVar6 >> 0x1d & 1) + iVar2 * 2);
      iVar7 = iVar7 + 1;
      iVar2 = p->nRegs;
    } while (iVar7 < iVar2);
  }
  pVVar4 = p->vCos;
  uVar5 = (ulong)(uint)pVVar4->nSize;
  if (p->nRegs < pVVar4->nSize) {
    lVar8 = 0;
    do {
      if ((int)uVar5 <= lVar8) {
LAB_001ce36b:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar2 = pVVar4->pArray[lVar8];
      if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) {
LAB_001ce34c:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return p_00;
      }
      uVar6 = *(uint *)(p->pObjs + iVar2);
      iVar2 = iVar2 - (uVar6 & 0x1fffffff);
      if (iVar2 < 0) {
LAB_001ce38a:
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      Vec_IntPush(p_00,(uVar6 >> 0x1d & 1) + iVar2 * 2);
      lVar8 = lVar8 + 1;
      pVVar4 = p->vCos;
      uVar5 = (ulong)pVVar4->nSize;
    } while (lVar8 < (long)(uVar5 - (long)p->nRegs));
  }
  return p_00;
}

Assistant:

Vec_Int_t * Gia_AigerCollectLiterals( Gia_Man_t * p )
{
    Vec_Int_t * vLits;
    Gia_Obj_t * pObj;
    int i;
    vLits = Vec_IntAlloc( Gia_ManPoNum(p) );
    Gia_ManForEachRi( p, pObj, i )
        Vec_IntPush( vLits, Gia_ObjFaninLit0p(p, pObj) );
    Gia_ManForEachPo( p, pObj, i )
        Vec_IntPush( vLits, Gia_ObjFaninLit0p(p, pObj) );
    return vLits;
}